

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O1

void test_cpp_wrapper_get_all(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  cpp_wrapper_setup(tc,dict,ion_fill_edge_cases);
  iVar1 = 0;
  iVar3 = 0;
  do {
    cpp_wrapper_get(tc,dict,iVar3,iVar1,'\0',1);
    iVar3 = iVar3 + 1;
    iVar1 = iVar1 + 2;
  } while (iVar3 != 10);
  uVar2 = 0x30;
  iVar1 = 0xfa;
  do {
    uVar2 = uVar2 + 2;
    cpp_wrapper_get(tc,dict,uVar2,iVar1,'\0',1);
    iVar1 = iVar1 + 10;
  } while (uVar2 < 0x62);
  uVar2 = 0x1ef;
  iVar1 = 5000;
  do {
    uVar2 = uVar2 + 5;
    cpp_wrapper_get(tc,dict,uVar2,iVar1,'\0',1);
    iVar1 = iVar1 + 0x32;
  } while (uVar2 < 0x3e3);
  iVar1 = -0x66;
  iVar3 = -300;
  do {
    iVar1 = iVar1 + 2;
    cpp_wrapper_get(tc,dict,iVar1,iVar3,'\0',1);
    iVar3 = iVar3 + 6;
  } while (iVar1 < -0x34);
  return;
}

Assistant:

void
test_cpp_wrapper_get_all(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	cpp_wrapper_setup(tc, dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		cpp_wrapper_get(tc, dict, i, i * 2, err_ok, 1);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		cpp_wrapper_get(tc, dict, i, i * 5, err_ok, 1);
	}
	ION_FILL_HIGH_LOOP(i) {
		cpp_wrapper_get(tc, dict, i, i * 10, err_ok, 1);
	}
	ION_FILL_EDGE_LOOP(i) {
		cpp_wrapper_get(tc, dict, i, i * 3, err_ok, 1);
	}
}